

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O1

Int __thiscall ipx::Basis::Factorize(Basis *this)

{
  Model *pMVar1;
  pointer piVar2;
  pointer piVar3;
  iterator __position;
  bool bVar4;
  uint uVar5;
  ostream *poVar6;
  Int IVar7;
  size_type sVar8;
  size_type __n;
  int iVar9;
  double dVar10;
  vector<int,_std::allocator<int>_> end;
  Timer timer;
  vector<int,_std::allocator<int>_> begin;
  double local_70;
  vector<int,_std::allocator<int>_> local_68;
  Timer local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  pMVar1 = this->model_;
  iVar9 = pMVar1->num_rows_;
  __n = (size_type)iVar9;
  Timer::Timer(&local_50);
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,(allocator_type *)&local_68);
  std::vector<int,_std::allocator<int>_>::vector(&local_68,__n,(allocator_type *)&local_70);
  if (0 < iVar9) {
    piVar2 = (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (pMVar1->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar8 = 0;
    do {
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar8] = piVar3[piVar2[sVar8]];
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar8] = piVar3[(long)piVar2[sVar8] + 1];
      sVar8 = sVar8 + 1;
    } while (__n != sVar8);
  }
  IVar7 = 0;
  do {
    uVar5 = LuUpdate::Factorize((this->lu_)._M_t.
                                super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>
                                .super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl,
                                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (pMVar1->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (pMVar1->AI_).values_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start,false);
    this->num_factorizations_ = this->num_factorizations_ + 1;
    local_70 = LuUpdate::fill_factor
                         ((this->lu_)._M_t.
                          super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>
                          .super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl);
    __position._M_current =
         (this->fill_factors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->fill_factors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->fill_factors_,__position,&local_70);
    }
    else {
      *__position._M_current = local_70;
      (this->fill_factors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    if ((uVar5 & 2) == 0) {
      iVar9 = 6;
      if ((uVar5 & 1) != 0) {
        bVar4 = TightenLuPivotTol(this);
        if (bVar4) {
          iVar9 = 6 - (uint)bVar4;
        }
        else {
          poVar6 = Control::Debug(this->control_,3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," LU factorization unstable with pivot tolerance ",0x30);
          dVar10 = LuUpdate::pivottol((this->lu_)._M_t.
                                      super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>
                                      .super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl);
          poVar6 = std::ostream::_M_insert<double>(dVar10);
          local_70 = (double)CONCAT71(local_70._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_70,1);
        }
      }
    }
    else {
      AdaptToSingularFactorization(this);
      iVar9 = 6;
      IVar7 = 0x12d;
    }
  } while (iVar9 != 6);
  dVar10 = Timer::Elapsed(&local_50);
  this->time_factorize_ = dVar10 + this->time_factorize_;
  this->factorization_is_fresh_ = true;
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (Int *)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (Int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return IVar7;
}

Assistant:

Int Basis::Factorize() {
    const Int m = model_.rows();
    const SparseMatrix& AI = model_.AI();
    Timer timer;

    // Build column pointers for passing to LU factorization.
    std::vector<Int> begin(m), end(m);
    for (Int i = 0; i < m; i++) {
        assert(basis_[i] >= 0);
        begin[i] = AI.begin(basis_[i]);
        end[i] = AI.end(basis_[i]);
    }

    Int err = 0;                // return code
    while (true) {
        Int flag = lu_->Factorize(begin.data(), end.data(), AI.rowidx(),
                                  AI.values(), false);
        num_factorizations_++;
        fill_factors_.push_back(lu_->fill_factor());
        if (flag & 2) {
            AdaptToSingularFactorization();
            err = IPX_ERROR_basis_singular;
            break;
        }
        if ((flag & 1) && TightenLuPivotTol()) {
            // The factorization was numerically unstable and the pivot
            // tolerance could be tightened. Repeat.
            continue;
        }
        if (flag & 1) {
            control_.Debug(3)
                << " LU factorization unstable with pivot tolerance "
                << lu_->pivottol() << '\n';
            // ignore instability
        }
        break;
    }
    time_factorize_ += timer.Elapsed();
    factorization_is_fresh_ = true;
    return err;
}